

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
                 *this,Index target,Index eventIndex)

{
  node_ptr plVar1;
  ulong uVar2;
  mapped_type *pmVar3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  Index source;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  Column_support *pCVar9;
  ID_index pivot;
  uint local_3c;
  Index local_38;
  Index local_34;
  
  local_38 = target;
  local_34 = target;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&this->reducedMatrixR_,&local_34);
  plVar1 = (pmVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  pCVar9 = &pmVar3->column_;
  source = 0xffffffff;
  local_3c = 0xffffffff;
  if (plVar1 != (node_ptr)pCVar9 && plVar1 != (node_ptr)0x0) {
    local_3c = *(uint *)&(pmVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.
                         prev_[1].next_;
  }
  if (local_3c == 0xffffffff) goto LAB_00112bc3;
  uVar2 = (this->pivotToColumnIndex_)._M_h._M_bucket_count;
  uVar6 = (ulong)local_3c % uVar2;
  p_Var7 = (this->pivotToColumnIndex_)._M_h._M_buckets[uVar6];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var7->_M_nxt, p_Var5 = p_Var7, *(uint *)&p_Var7->_M_nxt[1]._M_nxt != local_3c)) {
    while (p_Var7 = p_Var4, p_Var4 = p_Var7->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar2 != uVar6) ||
         (p_Var5 = p_Var7, *(uint *)&p_Var4[1]._M_nxt == local_3c)) goto LAB_00112baf;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_00112baf:
  if (p_Var5 == (__node_base_ptr)0x0) goto LAB_00112bb9;
  p_Var4 = p_Var5->_M_nxt;
  do {
    source = 0xffffffff;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      source = *(Index *)((long)&p_Var4[1]._M_nxt + 4);
    }
LAB_00112bc3:
    do {
      if ((local_3c == 0xffffffff) || (source == 0xffffffff)) {
        if (local_3c == 0xffffffff) {
          local_34 = local_38;
          pmVar3 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->reducedMatrixR_,&local_34);
          RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
          ::_add_bar(&this->super_RU_pairing_option,(pmVar3->super_Column_dimension_option).dim_,
                     eventIndex);
        }
        else {
          std::__detail::
          _Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::try_emplace<unsigned_int_const&,unsigned_int&>
                    ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->pivotToColumnIndex_,(const_iterator)0x0,&local_3c,&local_38);
          RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
          ::_update_barcode(&this->super_RU_pairing_option,local_3c,eventIndex);
        }
        return;
      }
      _reduce_column_by(this,local_38,source);
      plVar1 = (pCVar9->super_type).data_.root_plus_size_.m_header.super_node.next_;
      source = 0xffffffff;
      local_3c = 0xffffffff;
      if (plVar1 != (node_ptr)pCVar9 && plVar1 != (node_ptr)0x0) {
        local_3c = *(uint *)&(pmVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.
                             prev_[1].next_;
      }
    } while (local_3c == 0xffffffff);
    uVar2 = (this->pivotToColumnIndex_)._M_h._M_bucket_count;
    uVar6 = (ulong)local_3c % uVar2;
    p_Var7 = (this->pivotToColumnIndex_)._M_h._M_buckets[uVar6];
    p_Var5 = (__node_base_ptr)0x0;
    if ((p_Var7 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var7, p_Var8 = p_Var7->_M_nxt, *(uint *)&p_Var7->_M_nxt[1]._M_nxt != local_3c)) {
      while (p_Var4 = p_Var8->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar2 != uVar6) ||
           (p_Var5 = p_Var8, p_Var8 = p_Var4, *(uint *)&p_Var4[1]._M_nxt == local_3c))
        goto LAB_00112c7b;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
LAB_00112c7b:
    if (p_Var5 == (__node_base_ptr)0x0) {
LAB_00112bb9:
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var5->_M_nxt;
    }
  } while( true );
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}